

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  undefined8 in_RDX;
  shared_ptr<const_cxxopts::OptionDetails> *in_RDI;
  element_type *in_stack_ffffffffffffffd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe0;
  
  std::shared_ptr<const_cxxopts::OptionDetails>::shared_ptr
            ((shared_ptr<const_cxxopts::OptionDetails> *)&stack0xffffffffffffffd8,in_RDI);
  ensure_value((OptionValue *)in_stack_ffffffffffffffe0._M_pi,
               (shared_ptr<const_cxxopts::OptionDetails> *)in_stack_ffffffffffffffd8);
  std::shared_ptr<const_cxxopts::OptionDetails>::~shared_ptr
            ((shared_ptr<const_cxxopts::OptionDetails> *)0x141df5);
  in_RDI[1].super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       &((in_RDI[1].super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_short).field_0x1;
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x141e0a);
  (*peVar1->_vptr_Value[3])(peVar1,in_RDX);
  return;
}

Assistant:

void
        parse
                (
                        std::shared_ptr<const OptionDetails> details,
                        const std::string& text
                )
        {
            ensure_value(details);
            ++m_count;
            m_value->parse(text);
        }